

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_DoublingFactorCounterTest_FourClosedTriplets_TestShell::createTest
          (TEST_DoublingFactorCounterTest_FourClosedTriplets_TestShell *this)

{
  TEST_DoublingFactorCounterTest_FourClosedTriplets_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_FourClosedTriplets_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x29d);
  TEST_DoublingFactorCounterTest_FourClosedTriplets_Test::
  TEST_DoublingFactorCounterTest_FourClosedTriplets_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, FourClosedTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::OneOfCharacters, false);
	addTriplet(Tile::TwoOfCircles, false);
	addQuad(Tile::ThreeOfBamboos, false);
	addTriplet(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::FourClosedTriplets));
	CHECK_EQUAL(100, r.doubling_factor);
}